

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

errno_t rand_s(uint *randomValue)

{
  int iVar1;
  ulong uVar2;
  ssize_t sVar3;
  uint uVar4;
  Lock local_31;
  
  if (randomValue == (uint *)0x0) {
    return 1;
  }
  if ((GetRandom(unsigned_int*)::mutex_initialized == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GetRandom(unsigned_int*)::mutex_initialized), iVar1 != 0)) {
    GetRandom(unsigned_int*)::mutex_initialized = Lock::Init();
    __cxa_guard_release(&GetRandom(unsigned_int*)::mutex_initialized);
  }
  if (GetRandom(unsigned_int*)::mutex_initialized == '\0') {
    fprintf(_stderr,"pthread_mutex_init has failed");
    abort();
  }
  Lock::Lock(&local_31);
  uVar2 = (ulong)cache_index;
  if (uVar2 < 8) {
    cache_index = cache_index + 1;
    uVar4 = random_cache.result[uVar2];
  }
  else {
    uVar2 = 0;
    iVar1 = open64("/dev/urandom",0);
    do {
      sVar3 = read(iVar1,(void *)((long)&random_cache + uVar2),(ulong)(0x20 - (int)uVar2));
      if ((int)sVar3 < 0) {
        close(iVar1);
        goto LAB_0032eeb6;
      }
      uVar4 = (int)uVar2 + (int)sVar3;
      uVar2 = (ulong)uVar4;
    } while (uVar4 < 0x20);
    close(iVar1);
    *randomValue = random_cache.result[0];
    if (uVar4 == 0x20) {
      cache_index = 1;
      goto LAB_0032eecb;
    }
LAB_0032eeb6:
    iVar1 = rand();
    WEAK_RANDOM_SEED = WEAK_RANDOM_SEED + iVar1;
    uVar4 = rand_r(&WEAK_RANDOM_SEED);
  }
  *randomValue = uVar4;
LAB_0032eecb:
  Lock::~Lock(&local_31);
  return 0;
}

Assistant:

errno_t __cdecl rand_s(unsigned int* randomValue) noexcept
{
    if (randomValue == nullptr) return 1;

    GetRandom(randomValue);
    return 0;
}